

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  sqlite3 *db;
  byte *pbVar1;
  RenameCtx *pRVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *z;
  char *z_00;
  RenameToken *pRVar7;
  int iVar8;
  RenameToken *p;
  RenameCtx *pRVar9;
  char *__src;
  bool bVar10;
  ulong local_78;
  
  uVar3 = sqlite3Strlen30(zNew);
  uVar4 = sqlite3Strlen30(zSql);
  local_78 = (ulong)uVar4;
  db = pCtx->pOut->db;
  z = sqlite3MPrintf(db,"\"%w\"",zNew);
  if (z == (char *)0x0) {
    iVar8 = 7;
  }
  else {
    uVar5 = sqlite3Strlen30(z);
    if (bQuote != 0) {
      zNew = z;
      uVar3 = uVar5;
    }
    z_00 = (char *)sqlite3DbMallocZero(db,(long)(int)(uVar4 + pRename->nList * uVar5 + 1));
    if (z_00 == (char *)0x0) {
      iVar8 = 7;
    }
    else {
      memcpy(z_00,zSql,local_78);
      while (pRVar7 = pRename->pList, p = pRVar7, pRVar7 != (RenameToken *)0x0) {
        while (pRVar7 = pRVar7->pNext, pRVar2 = pRename, pRVar7 != (RenameToken *)0x0) {
          if ((p->t).z < (pRVar7->t).z) {
            p = pRVar7;
          }
        }
        do {
          pRVar9 = pRVar2;
          pRVar7 = pRVar9->pList;
          pRVar2 = (RenameCtx *)&pRVar7->pNext;
        } while (pRVar7 != p);
        pRVar9->pList = p->pNext;
        pbVar1 = (byte *)(p->t).z;
        bVar10 = (""[*pbVar1] & 0x46) == 0;
        uVar4 = uVar3;
        if (bVar10) {
          uVar4 = uVar5;
        }
        __src = zNew;
        if (bVar10) {
          __src = z;
        }
        iVar8 = (int)pbVar1 - (int)zSql;
        uVar6 = (p->t).n;
        if (uVar6 != uVar4) {
          uVar6 = uVar6 + iVar8;
          memmove(z_00 + (iVar8 + uVar4),z_00 + uVar6,(ulong)((int)local_78 - uVar6));
          uVar6 = (int)local_78 + (uVar4 - (p->t).n);
          local_78 = (ulong)uVar6;
          z_00[(int)uVar6] = '\0';
        }
        memcpy(z_00 + iVar8,__src,(ulong)uVar4);
        sqlite3DbFree(db,p);
      }
      sqlite3_result_text(pCtx,z_00,-1,(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3DbFreeNN(db,z_00);
      iVar8 = 0;
    }
    sqlite3_free(z);
  }
  return iVar8;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  int nNew = sqlite3Strlen30(zNew);
  int nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot;
  char *zOut;
  int nQuot;

  /* Set zQuot to point to a buffer containing a quoted copy of the 
  ** identifier zNew. If the corresponding identifier in the original 
  ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
  ** point to zQuot so that all substitutions are made using the
  ** quoted version of the new column name.  */
  zQuot = sqlite3MPrintf(db, "\"%w\"", zNew);
  if( zQuot==0 ){
    return SQLITE_NOMEM;
  }else{
    nQuot = sqlite3Strlen30(zQuot);
  }
  if( bQuote ){
    zNew = zQuot;
    nNew = nQuot;
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name. All that remains is to construct and
  ** return the edited SQL string. */
  assert( nQuot>=nNew );
  zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      RenameToken *pBest = renameColumnTokenNext(pRename);

      u32 nReplace;
      const char *zReplace;
      if( sqlite3IsIdChar(*pBest->t.z) ){
        nReplace = nNew;
        zReplace = zNew;
      }else{
        nReplace = nQuot;
        zReplace = zQuot;
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n], 
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}